

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

void __thiscall basisu::image::image(image *this,image *other)

{
  undefined4 *in_RDI;
  image *in_stack_ffffffffffffffc8;
  image *this_00;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  this_00 = (image *)(in_RDI + 4);
  vector<basisu::color_rgba>::vector((vector<basisu::color_rgba> *)this_00);
  operator=(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

image(const image &other) :
			m_width(0), m_height(0), m_pitch(0)
		{
			*this = other;
		}